

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O3

void __thiscall CFieldList::Add(CFieldList *this,CField *_field)

{
  __uniq_ptr_impl<CField,_std::default_delete<CField>_> local_10;
  
  local_10._M_t.super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
  super__Head_base<0UL,_CField_*,_false>._M_head_impl =
       (tuple<CField_*,_std::default_delete<CField>_>)
       (tuple<CField_*,_std::default_delete<CField>_>)_field;
  std::
  vector<std::unique_ptr<CField,std::default_delete<CField>>,std::allocator<std::unique_ptr<CField,std::default_delete<CField>>>>
  ::emplace_back<std::unique_ptr<CField,std::default_delete<CField>>>
            ((vector<std::unique_ptr<CField,std::default_delete<CField>>,std::allocator<std::unique_ptr<CField,std::default_delete<CField>>>>
              *)&this->fields,(unique_ptr<CField,_std::default_delete<CField>_> *)&local_10);
  if ((_Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>)
      local_10._M_t.super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
      super__Head_base<0UL,_CField_*,_false>._M_head_impl != (CField *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
                          super__Head_base<0UL,_CField_*,_false>._M_head_impl + 0x10))();
  }
  return;
}

Assistant:

void CFieldList::Add(CField* _field) {
	fields.push_back(std::unique_ptr<CField>(_field));
}